

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorText.cpp
# Opt level: O0

void __thiscall Rml::DecoratorText::DecoratorText(DecoratorText *this)

{
  DecoratorText *this_local;
  
  Decorator::Decorator(&this->super_Decorator);
  (this->super_Decorator)._vptr_Decorator = (_func_int **)&PTR__DecoratorText_00815ed8;
  ::std::__cxx11::string::string((string *)&this->text);
  this->inherit_color = false;
  Colour<unsigned_char,_255,_false>::Colour(&this->color,'\0',0xff);
  Vector2<Rml::NumericValue>::Vector2(&this->align);
  return;
}

Assistant:

DecoratorText::DecoratorText() {}